

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DateImplementation.h
# Opt level: O1

double Js::DateImplementation::GetTvLcl<Js::ScriptContext>
                 (double tv,ScriptContext *scriptContext,TZD *ptzd)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  double dVar4;
  int local_2c;
  Type local_28;
  int bias;
  int offset;
  bool isDaylightSavings;
  
  if (scriptContext == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/DateImplementation.h"
                                ,0x119,"(scriptContext)","scriptContext");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  if (ptzd != (TZD *)0x0) {
    ptzd->minutes = 0;
    ptzd->fDst = false;
  }
  bVar2 = NumberUtilities::IsNan(tv);
  if (((8.64e+15 < tv) || (tv < -8.64e+15)) || (bVar2)) {
    dVar4 = NAN;
  }
  else {
    dVar4 = PlatformAgnostic::DateTime::DaylightTimeHelper::UtcToLocal
                      (&scriptContext->daylightTimeHelper,tv,&local_2c,&local_28,
                       (bool *)((long)&bias + 3));
    if (ptzd != (TZD *)0x0) {
      ptzd->minutes = -local_2c;
      ptzd->offset = local_28;
      ptzd->fDst = (Type)bias._3_1_;
    }
  }
  return dVar4;
}

Assistant:

double DateImplementation::GetTvLcl(double tv, ScriptContext *scriptContext, TZD *ptzd)
    {
        Assert(scriptContext);

        double tvLcl;

        if (nullptr != ptzd)
        {
            ptzd->minutes = 0;
            ptzd->fDst = FALSE;
        }

        // See if we're out of range before conversion (UTC time value must be within this range)
        if (JavascriptNumber::IsNan(tv) || tv < ktvMin || tv > ktvMax)
        {
            return JavascriptNumber::NaN;
        }

        int bias;
        int offset;
        bool isDaylightSavings;
        tvLcl = scriptContext->GetDaylightTimeHelper()->UtcToLocal(tv, bias, offset, isDaylightSavings);
        if (nullptr != ptzd)
        {
            ptzd->minutes = -bias;
            ptzd->offset = offset;
            ptzd->fDst = isDaylightSavings;
        }
        return tvLcl;
    }